

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcg64_shift.hpp
# Opt level: O0

double trng::lcg64_shift::pow(double __x,double __y)

{
  result_type in_RSI;
  result_type result;
  result_type n_local;
  result_type x_local;
  
  for (n_local = in_RSI; n_local != 0; n_local = n_local >> 1) {
  }
  return __x;
}

Assistant:

TRNG_CUDA_ENABLE
  inline lcg64_shift::result_type lcg64_shift::pow(lcg64_shift::result_type x,
                                                   lcg64_shift::result_type n) {
    lcg64_shift::result_type result{1};
    while (n > 0) {
      if ((n & 1u) > 0)
        result *= x;
      x *= x;
      n >>= 1u;
    }
    return result;
  }